

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMutex.h
# Opt level: O3

void __thiscall liblogger::LogMutex::Lock(LogMutex *this)

{
  LogException *this_00;
  int iVar1;
  string local_40;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (-1 < iVar1) {
    return;
  }
  this_00 = (LogException *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"pthread_mutex_lock failed","");
  LogException::LogException(this_00,&local_40);
  __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void Lock() {
				if (pthread_mutex_lock(&m_mutex) < 0)
					throw(LogException("pthread_mutex_lock failed"));
			}